

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O0

UINT16 __thiscall
VGMPlayer::GetChipVolume(VGMPlayer *this,UINT8 chipType,UINT8 chipID,UINT8 isLinked)

{
  byte bVar1;
  UINT32 UVar2;
  size_type sVar3;
  const_reference pvVar4;
  XHDR_DATA16 *cData;
  UINT16 vol;
  ulong uStack_28;
  UINT16 numChips;
  size_t curChip;
  UINT8 isLinked_local;
  UINT8 chipID_local;
  UINT8 chipType_local;
  VGMPlayer *this_local;
  
  if (chipType < 0x2a) {
    cData._4_2_ = _CHIP_VOLUME[chipType];
    UVar2 = GetChipCount(this,chipType);
    cData._6_2_ = (ushort)UVar2;
    if ((chipType == '\0') && (UVar2 = GetHeaderChipClock(this,'\0'), (UVar2 & 0x80000000) != 0)) {
      cData._6_2_ = 1;
    }
    if ((isLinked != '\0') && (chipType == '\x06')) {
      cData._4_2_ = cData._4_2_ / 2;
    }
    if (1 < cData._6_2_) {
      cData._4_2_ = (UINT16)((ulong)cData._4_2_ / (ulong)(long)(int)(uint)cData._6_2_);
    }
    bVar1 = isLinked << 7 | chipType & 0x7f;
    for (uStack_28 = 0;
        sVar3 = std::vector<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>::size
                          (&this->_xHdrChipVol), uStack_28 < sVar3; uStack_28 = uStack_28 + 1) {
      pvVar4 = std::vector<VGMPlayer::XHDR_DATA16,_std::allocator<VGMPlayer::XHDR_DATA16>_>::
               operator[](&this->_xHdrChipVol,uStack_28);
      if ((pvVar4->type == bVar1) && ((pvVar4->flags & 1) == chipID)) {
        if ((pvVar4->data & 0x8000) == 0) {
          cData._4_2_ = pvVar4->data;
        }
        else {
          cData._4_2_ = MulFixed8x8(cData._4_2_,pvVar4->data & 0x7fff);
        }
        break;
      }
    }
    if (bVar1 == 0x19) {
      cData._4_2_ = (UINT16)(((uint)cData._4_2_ << 3) / 5);
    }
    else if (bVar1 == 0x1c) {
      cData._4_2_ = (UINT16)((ulong)((uint)cData._4_2_ * 2 + 1) / 3);
    }
    this_local._6_2_ = cData._4_2_;
  }
  else {
    this_local._6_2_ = 0;
  }
  return this_local._6_2_;
}

Assistant:

UINT16 VGMPlayer::GetChipVolume(UINT8 chipType, UINT8 chipID, UINT8 isLinked) const
{
	if (chipType >= _CHIP_COUNT)
		return 0;
	
	size_t curChip;
	UINT16 numChips;
	UINT16 vol = _CHIP_VOLUME[chipType];
	
	numChips = GetChipCount(chipType);
	if (chipType == 0x00)
	{
		// The T6W28 consists of 2 "half" chips, so we need to treat it as 1.
		if (GetHeaderChipClock(chipType) & 0x80000000)
			numChips = 1;
	}
	
	if (isLinked)
	{
		if (chipType == 0x06)
			vol /= 2;	// the YM2203's SSG should be half as loud as the FM part
	}
	if (numChips > 1)
		vol /= numChips;
	
	chipType = (isLinked << 7) | (chipType & 0x7F);
	for (curChip = 0; curChip < _xHdrChipVol.size(); curChip ++)
	{
		const XHDR_DATA16& cData = _xHdrChipVol[curChip];
		if (cData.type == chipType && (cData.flags & 0x01) == chipID)
		{
			// Bit 15 - absolute/relative volume
			//	0 - absolute
			//	1 - relative (0x0100 = 1.0, 0x80 = 0.5, etc.)
			if (cData.data & 0x8000)
				vol = MulFixed8x8(vol, cData.data & 0x7FFF);
			else
				vol = cData.data;
			break;
		}
	}
	
	// additional patches for adjusted volume scale in sound cores
	if (chipType == 0x19)	// K051649
		vol = vol * 8 / 5;
	else if (chipType == 0x1C)	// C140/C219
		vol = (vol * 2 + 1) / 3;
	return vol;
}